

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_tile.c
# Opt level: O0

uint32_t TIFFComputeTile(TIFF *tif,uint32_t x,uint32_t y,uint32_t z,uint16_t s)

{
  uint local_50;
  uint local_4c;
  uint local_48;
  uint32_t zpt;
  uint32_t ypt;
  uint32_t xpt;
  uint32_t tile;
  uint32_t dz;
  uint32_t dy;
  uint32_t dx;
  TIFFDirectory *td;
  uint16_t s_local;
  uint32_t z_local;
  uint32_t y_local;
  uint32_t x_local;
  TIFF *tif_local;
  
  dz = (tif->tif_dir).td_tilewidth;
  tile = (tif->tif_dir).td_tilelength;
  xpt = (tif->tif_dir).td_tiledepth;
  ypt = 1;
  td._4_4_ = z;
  if ((tif->tif_dir).td_imagedepth == 1) {
    td._4_4_ = 0;
  }
  if (dz == 0xffffffff) {
    dz = (tif->tif_dir).td_imagewidth;
  }
  if (tile == 0xffffffff) {
    tile = (tif->tif_dir).td_imagelength;
  }
  if (xpt == 0xffffffff) {
    xpt = (tif->tif_dir).td_imagedepth;
  }
  if (((dz != 0) && (tile != 0)) && (xpt != 0)) {
    if ((tif->tif_dir).td_imagewidth < -(dz - 1) - 1) {
      local_48 = ((tif->tif_dir).td_imagewidth + (dz - 1)) / dz;
    }
    else {
      local_48 = 0;
    }
    if ((tif->tif_dir).td_imagelength < -(tile - 1) - 1) {
      local_4c = ((tif->tif_dir).td_imagelength + (tile - 1)) / tile;
    }
    else {
      local_4c = 0;
    }
    if ((tif->tif_dir).td_imagedepth < -(xpt - 1) - 1) {
      local_50 = ((tif->tif_dir).td_imagedepth + (xpt - 1)) / xpt;
    }
    else {
      local_50 = 0;
    }
    if ((tif->tif_dir).td_planarconfig == 2) {
      ypt = local_48 * local_4c * local_50 * (uint)s + local_48 * local_4c * (td._4_4_ / xpt) +
            local_48 * (y / tile) + x / dz;
    }
    else {
      ypt = local_48 * local_4c * (td._4_4_ / xpt) + local_48 * (y / tile) + x / dz;
    }
  }
  return ypt;
}

Assistant:

uint32_t TIFFComputeTile(TIFF *tif, uint32_t x, uint32_t y, uint32_t z,
                         uint16_t s)
{
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t dx = td->td_tilewidth;
    uint32_t dy = td->td_tilelength;
    uint32_t dz = td->td_tiledepth;
    uint32_t tile = 1;

    if (td->td_imagedepth == 1)
        z = 0;
    if (dx == (uint32_t)-1)
        dx = td->td_imagewidth;
    if (dy == (uint32_t)-1)
        dy = td->td_imagelength;
    if (dz == (uint32_t)-1)
        dz = td->td_imagedepth;
    if (dx != 0 && dy != 0 && dz != 0)
    {
        uint32_t xpt = TIFFhowmany_32(td->td_imagewidth, dx);
        uint32_t ypt = TIFFhowmany_32(td->td_imagelength, dy);
        uint32_t zpt = TIFFhowmany_32(td->td_imagedepth, dz);

        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
            tile = (xpt * ypt * zpt) * s + (xpt * ypt) * (z / dz) +
                   xpt * (y / dy) + x / dx;
        else
            tile = (xpt * ypt) * (z / dz) + xpt * (y / dy) + x / dx;
    }
    return (tile);
}